

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  string *psVar1;
  size_type sVar2;
  undefined8 uVar3;
  char *pcVar4;
  unsigned_long local_30 [2];
  size_type local_20;
  
  psVar1 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(count,0,"count >= 0");
  if (psVar1 == (string *)0x0) {
    if (this->target_ == (string *)0x0) {
      pcVar4 = "target_ != nullptr";
      sVar2 = 0x12;
      uVar3 = 0x97;
    }
    else {
      local_30[0] = (unsigned_long)count;
      local_20 = this->target_->_M_string_length;
      psVar1 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                         (local_30,&local_20,"static_cast<size_t>(count) <= target_->size()");
      if (psVar1 == (string *)0x0) {
        std::__cxx11::string::resize((ulong)this->target_);
        return;
      }
      pcVar4 = (psVar1->_M_dataplus)._M_p;
      sVar2 = psVar1->_M_string_length;
      uVar3 = 0x98;
    }
  }
  else {
    pcVar4 = (psVar1->_M_dataplus)._M_p;
    sVar2 = psVar1->_M_string_length;
    uVar3 = 0x96;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,uVar3,sVar2,pcVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30);
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}